

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall QResourceFileEnginePrivate::unmapUncompressed_sys(QResourceFileEnginePrivate *this)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  void *__addr;
  ulong uVar4;
  
  pcVar1 = (this->uncompressed).d.ptr;
  lVar2 = (this->uncompressed).d.size;
  iVar3 = getpagesize();
  uVar4 = -(long)iVar3;
  __addr = (void *)((ulong)pcVar1 & uVar4);
  munmap(__addr,(uVar4 & (ulong)(pcVar1 + iVar3 + lVar2 + -1)) - (long)__addr);
  return;
}

Assistant:

const T *data() const noexcept { return ptr; }